

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

MOJOSHADER_astDataType *
match_func_to_call(Context_conflict *ctx,MOJOSHADER_astExpressionCallFunction *ast)

{
  MOJOSHADER_astExpression **ppMVar1;
  MOJOSHADER_astDataTypeType MVar2;
  char *key;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  MOJOSHADER_astDataType *pMVar7;
  MOJOSHADER_astDataType *pMVar8;
  int iVar9;
  ulong uVar10;
  MOJOSHADER_astArguments *pMVar11;
  bool bVar12;
  void *value;
  void *iter;
  void *local_90;
  int local_84;
  MOJOSHADER_astExpressionIdentifier *local_80;
  void *local_78;
  void *local_70;
  ulong local_68;
  char *local_60;
  MOJOSHADER_astExpressionCallFunction *local_58;
  undefined8 local_50;
  MOJOSHADER_astDataType *local_48;
  ulong local_40;
  MOJOSHADER_astDataType *local_38;
  
  local_80 = ast->identifier;
  key = local_80->identifier;
  local_90 = (void *)0x0;
  local_70 = (void *)0x0;
  pMVar11 = ast->args;
  uVar10 = 0;
  local_58 = ast;
  if (pMVar11 != (MOJOSHADER_astArguments *)0x0) {
    uVar10 = 0;
    do {
      uVar10 = (ulong)((int)uVar10 + 1);
      type_check_ast(ctx,pMVar11->argument);
      pMVar11 = pMVar11->next;
    } while (pMVar11 != (MOJOSHADER_astArguments *)0x0);
  }
  iVar3 = hash_iter((ctx->variables).hash,key,&local_90,&local_70);
  iVar9 = (int)uVar10;
  if (iVar3 == 0) {
    failf(ctx,"No matching function named \'%s\'",key);
    return local_80->datatype;
  }
  local_84 = iVar9 * 4;
  local_78 = local_90;
  local_68 = uVar10;
  local_60 = key;
  local_40 = uVar10;
  pMVar7 = reduce_datatype(ctx,*(MOJOSHADER_astDataType **)((long)local_90 + 8));
  uVar5 = 1;
  if (pMVar7->type == MOJOSHADER_AST_DATATYPE_FUNCTION) {
    iVar3 = 0;
    if (iVar9 == (pMVar7->function).num_params) {
      local_50 = 0;
      pMVar11 = local_58->args;
      iVar3 = 0;
      if (iVar9 != 0) {
        uVar10 = 1;
        local_38 = pMVar7;
        do {
          if (pMVar11 == (MOJOSHADER_astArguments *)0x0) {
            __assert_fail("args != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                          ,0x9b8,
                          "const MOJOSHADER_astDataType *match_func_to_call(Context *, MOJOSHADER_astExpressionCallFunction *)"
                         );
          }
          ppMVar1 = &pMVar11->argument;
          pMVar11 = pMVar11->next;
          pMVar7 = (*ppMVar1)->datatype;
          pMVar8 = *(MOJOSHADER_astDataType **)((local_38->user).name + uVar10 * 8 + -8);
          iVar4 = datatypes_match(pMVar7,pMVar8);
          iVar9 = 4;
          if (iVar4 == 0) {
            pMVar7 = reduce_datatype(ctx,pMVar7);
            pMVar8 = reduce_datatype(ctx,pMVar8);
            MVar2 = pMVar7->type;
            if (MVar2 - MOJOSHADER_AST_DATATYPE_STRING < 0xfffffff8) {
              iVar4 = 0;
              iVar9 = iVar4;
              if (MVar2 == pMVar8->type) {
                if (MVar2 == MOJOSHADER_AST_DATATYPE_MATRIX) {
                  iVar9 = 0;
                  if ((pMVar7->array).elements == (pMVar8->array).elements) {
                    bVar12 = (pMVar7->matrix).columns == (pMVar8->matrix).columns;
                    goto LAB_00144a6b;
                  }
                }
                else if (MVar2 == MOJOSHADER_AST_DATATYPE_VECTOR) {
                  bVar12 = (pMVar7->array).elements == (pMVar8->array).elements;
LAB_00144a6b:
                  iVar9 = iVar4;
                  if (bVar12) goto LAB_00144a76;
                }
              }
            }
            else {
LAB_00144a76:
              pMVar7 = datatype_base(ctx,pMVar7);
              pMVar8 = datatype_base(ctx,pMVar8);
              uVar5 = datatype_size(pMVar7);
              uVar6 = datatype_size(pMVar8);
              if ((pMVar7->type - MOJOSHADER_AST_DATATYPE_HALF < 0xfffffffd) ||
                 (iVar9 = 1, pMVar8->type - MOJOSHADER_AST_DATATYPE_FLOAT < 3)) {
                iVar9 = 3;
                if (uVar5 != uVar6) {
                  iVar9 = (uVar5 < uVar6) + 1;
                }
              }
            }
          }
          iVar3 = iVar3 + iVar9;
          if (iVar9 == 0) {
            pMVar11 = (MOJOSHADER_astArguments *)0x0;
            iVar3 = 0;
            break;
          }
          bVar12 = uVar10 < local_40;
          uVar10 = uVar10 + 1;
        } while (bVar12);
      }
      if (pMVar11 != (MOJOSHADER_astArguments *)0x0) {
        iVar3 = 0;
      }
    }
    pMVar7 = local_48;
    if (iVar3 == 0) {
      uVar5 = 4;
    }
    else {
      uVar6 = 5;
      if (iVar3 != local_84) {
        uVar5 = 0;
        if ((iVar3 < 0) || (uVar6 = 0, iVar3 == 0)) goto LAB_00144b4c;
      }
      uVar5 = uVar6;
    }
  }
LAB_00144b4c:
  local_48 = pMVar7;
  pMVar7 = (MOJOSHADER_astDataType *)
           (*(code *)((long)&DAT_00159338 + (long)(int)(&DAT_00159338)[uVar5]))();
  return pMVar7;
}

Assistant:

static const MOJOSHADER_astDataType *match_func_to_call(Context *ctx,
                                    MOJOSHADER_astExpressionCallFunction *ast)
{
    SymbolScope *best = NULL;  // best choice we find.
    int best_score = 0;
    MOJOSHADER_astExpressionIdentifier *ident = ast->identifier;
    const char *sym = ident->identifier;
    const void *value = NULL;
    void *iter = NULL;

    int argcount = 0;
    MOJOSHADER_astArguments *args = ast->args;
    while (args != NULL)
    {
        argcount++;
        type_check_ast(ctx, args->argument);
        args = args->next;
    } // while;

    // we do some tapdancing to handle function overloading here.
    int match = 0;
    while (hash_iter(ctx->variables.hash, sym, &value, &iter))
    {
        SymbolScope *item = (SymbolScope *) value;
        const MOJOSHADER_astDataType *dt = item->datatype;
        dt = reduce_datatype(ctx, dt);
        // there's a locally-scoped symbol with this name? It takes precedence.
        if (dt->type != MOJOSHADER_AST_DATATYPE_FUNCTION)
            return dt;

        const MOJOSHADER_astDataTypeFunction *dtfn = (MOJOSHADER_astDataTypeFunction *) dt;
        const int perfect = argcount * ((int) DT_MATCH_PERFECT);
        int score = 0;

        if (argcount == dtfn->num_params)  // !!! FIXME: default args.
        {
            args = ast->args;
            int i;
            for (i = 0; i < argcount; i++)
            {
                assert(args != NULL);
                dt = args->argument->datatype;
                args = args->next;
                const DatatypeMatch compatible = compatible_arg_datatype(ctx, dt, dtfn->params[i]);
                if (compatible == DT_MATCH_INCOMPATIBLE)
                {
                    args = NULL;
                    score = 0;
                    break;
                } // if

                score += (int) compatible;
            } // for

            if (args != NULL)
                score = 0;  // too many arguments supplied. No match.
        } // else

        if (score == 0)  // incompatible.
            continue;

        else if (score == perfect)  // perfection! stop looking!
        {
            match = 1;  // ignore all other compatible matches.
            best = item;
            break;
        } // if

        else if (score >= best_score)  // compatible, but not perfect, match.
        {
            if (score == best_score)
            {
                match++;
                // !!! FIXME: list each possible function in a fail(),
                // !!! FIXME:  but you can't actually fail() here, since
                // !!! FIXME:  this may cease to be ambiguous if we get
                // !!! FIXME:  a better match on a later overload.
            } // if

            else if (score > best_score)
            {
                match = 1;  // reset the ambiguousness count.
                best = item;
                best_score = score;
            } // if
        } // else if
    } // while

    if (match > 1)
    {
        assert(best != NULL);
        failf(ctx, "Ambiguous function call to '%s'", sym);
    } // if

    if (best == NULL)
    {
        assert(match == 0);
        assert(best_score == 0);
        // !!! FIXME: ident->datatype = ?
        failf(ctx, "No matching function named '%s'", sym);
    } // if
    else
    {
        ident->datatype = reduce_datatype(ctx, best->datatype);
        ident->index = best->index;
    } // else

    return ident->datatype;
}